

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

PSprite __thiscall SpriteBase::create_mask(SpriteBase *this,PSprite *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  PSprite PVar6;
  uint local_74;
  undefined4 *puStack_70;
  uint i;
  uint32_t *res;
  uint32_t *src2;
  uint32_t *src1;
  enable_shared_from_this<Data::Sprite> local_48;
  shared_ptr<Data::Sprite> local_38;
  undefined1 local_21;
  PSprite *other_local;
  SpriteBase *this_local;
  PSprite *result;
  
  p_Var1 = other[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  other_local = other;
  this_local = this;
  peVar5 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  iVar3 = (*peVar5->_vptr_Sprite[1])();
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar3)) {
    peVar2 = other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar5 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RDX);
    iVar3 = (*peVar5->_vptr_Sprite[2])();
    if (peVar2 == (element_type *)CONCAT44(extraout_var_00,iVar3)) {
      local_21 = 0;
      std::enable_shared_from_this<Data::Sprite>::shared_from_this(&local_48);
      std::make_shared<SpriteBase,std::shared_ptr<Data::Sprite>>(&local_38);
      std::shared_ptr<Data::Sprite>::shared_ptr<SpriteBase,void>
                ((shared_ptr<Data::Sprite> *)this,(shared_ptr<SpriteBase> *)&local_38);
      std::shared_ptr<SpriteBase>::~shared_ptr((shared_ptr<SpriteBase> *)&local_38);
      std::shared_ptr<Data::Sprite>::~shared_ptr((shared_ptr<Data::Sprite> *)&local_48);
      src2 = (uint32_t *)
             other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      peVar5 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RDX);
      iVar3 = (**peVar5->_vptr_Sprite)();
      peVar5 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      iVar4 = (**peVar5->_vptr_Sprite)();
      puStack_70 = (undefined4 *)CONCAT44(extraout_var_02,iVar4);
      res = (uint32_t *)CONCAT44(extraout_var_01,iVar3);
      for (local_74 = 0;
          (ulong)local_74 <
          (ulong)((long)other[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi *
                 (long)other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ; local_74 = local_74 + 1) {
        if (*src2 == *res) {
          *puStack_70 = 0;
        }
        else {
          *puStack_70 = 0xffffffff;
        }
        puStack_70 = puStack_70 + 1;
        res = res + 1;
        src2 = src2 + 1;
      }
      goto LAB_00169a70;
    }
  }
  std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)this,(nullptr_t)0x0);
  other = (PSprite *)extraout_RDX;
LAB_00169a70:
  PVar6.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  PVar6.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Sprite;
  return (PSprite)PVar6.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
SpriteBase::create_mask(Data::PSprite other) {
  if ((width != other->get_width()) || (height != other->get_height())) {
    return nullptr;
  }

  Data::PSprite result = std::make_shared<SpriteBase>(shared_from_this());

  uint32_t *src1 = reinterpret_cast<uint32_t*>(data);
  uint32_t *src2 = reinterpret_cast<uint32_t*>(other->get_data());
  uint32_t *res = reinterpret_cast<uint32_t*>(result->get_data());

  for (unsigned int i = 0; i < width * height; i++) {
    if (*src1++ == *src2++) {
      *res++ = 0x00000000;
    } else {
      *res++ = 0xFFFFFFFF;
    }
  }

  return result;
}